

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_update_ad(mbedtls_cipher_context_t *ctx,uchar *ad,size_t ad_len)

{
  size_t ad_len_local;
  uchar *ad_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if ((ctx == (mbedtls_cipher_context_t *)0x0) || (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0)
     ) {
    ctx_local._4_4_ = -0x6100;
  }
  else if (ctx->cipher_info->mode == MBEDTLS_MODE_GCM) {
    ctx_local._4_4_ =
         mbedtls_gcm_starts((mbedtls_gcm_context *)ctx->cipher_ctx,ctx->operation,ctx->iv,
                            ctx->iv_size,ad,ad_len);
  }
  else {
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_update_ad( mbedtls_cipher_context_t *ctx,
                      const unsigned char *ad, size_t ad_len )
{
    if( NULL == ctx || NULL == ctx->cipher_info )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
    {
        return mbedtls_gcm_starts( (mbedtls_gcm_context *) ctx->cipher_ctx, ctx->operation,
                           ctx->iv, ctx->iv_size, ad, ad_len );
    }

    return( 0 );
}